

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

ostream * GEO::Logger::warn(string *feature)

{
  Logger *this;
  ostream *poVar1;
  
  if ((instance_ != 0) && (::(anonymous_namespace)::running_threads_invocations_ < 1)) {
    this = instance();
    poVar1 = warn_stream(this,feature);
    return poVar1;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"(W)-[");
  poVar1 = std::operator<<(poVar1,(string *)feature);
  poVar1 = std::operator<<(poVar1,"] ");
  return poVar1;
}

Assistant:

std::ostream& Logger::warn(const std::string& feature) {
	std::ostream& result = 
	    (is_initialized() && !Process::is_running_threads()) ?	    	    
            instance()->warn_stream(feature) :
            (std::cerr << "(W)-[" << feature << "] ");
	return result;
    }